

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O3

VkClearValue vkt::anon_unknown_0::randomClearValue(Attachment *attachment,Random *rng)

{
  bool bVar1;
  deBool dVar2;
  TextureFormat TVar3;
  ulong uVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  ChannelOrder order;
  ulong uVar6;
  VkClearColorValue VVar7;
  VkClearValue VVar8;
  
  TVar3 = ::vk::mapVkFormat(attachment->m_format);
  order = TVar3.order;
  bVar1 = tcu::hasStencilComponent(order);
  if ((bVar1) || (bVar1 = tcu::hasDepthComponent(order), bVar1)) {
    bVar1 = tcu::hasStencilComponent(order);
    if (bVar1) {
      dVar2 = deRandom_getBool(&rng->m_rnd);
      uVar6 = 0xff00000000;
      if (dVar2 != 1) {
        uVar6 = 0;
      }
    }
    else {
      uVar6 = 0xcd00000000;
    }
    bVar1 = tcu::hasDepthComponent(order);
    if (bVar1) {
      dVar2 = deRandom_getBool(&rng->m_rnd);
      uVar4 = 0x3f800000;
      uVar5 = extraout_RDX_00;
      if (dVar2 != 1) {
        uVar4 = 0;
      }
    }
    else {
      uVar4 = 0x7fffffff;
      uVar5 = extraout_RDX;
    }
  }
  else {
    VVar7 = randomColorClearValue((Attachment *)(ulong)attachment->m_format,rng);
    uVar5 = VVar7._8_8_;
    uVar6 = VVar7._0_8_ & 0xffffffff00000000;
    uVar4 = (ulong)VVar7.uint32[0];
  }
  VVar8._0_8_ = uVar4 | uVar6;
  VVar8._8_8_ = uVar5;
  return VVar8;
}

Assistant:

VkClearValue randomClearValue (const Attachment& attachment, de::Random& rng)
{
	const float					clearNan	= tcu::Float32::nan().asFloat();
	const tcu::TextureFormat	format		= mapVkFormat(attachment.getFormat());

	if (tcu::hasStencilComponent(format.order) || tcu::hasDepthComponent(format.order))
	{
		VkClearValue clearValue;

		clearValue.depthStencil.depth	= clearNan;
		clearValue.depthStencil.stencil	= 0xCDu;

		if (tcu::hasStencilComponent(format.order))
			clearValue.depthStencil.stencil	= rng.getBool()
											? 0xFFu
											: 0x0u;

		if (tcu::hasDepthComponent(format.order))
			clearValue.depthStencil.depth	= rng.getBool()
											? 1.0f
											: 0.0f;

		return clearValue;
	}
	else
	{
		VkClearValue clearValue;

		clearValue.color = randomColorClearValue(attachment, rng);

		return clearValue;
	}
}